

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

int clear_mark(int tag_mark,int max_mark,int n_row,Colamd_Row *Row)

{
  int local_24;
  int r;
  Colamd_Row *Row_local;
  int n_row_local;
  int max_mark_local;
  int tag_mark_local;
  
  if ((tag_mark < 1) || (n_row_local = tag_mark, max_mark <= tag_mark)) {
    for (local_24 = 0; local_24 < n_row; local_24 = local_24 + 1) {
      if (-1 < Row[local_24].shared2.mark) {
        Row[local_24].shared2.mark = 0;
      }
    }
    n_row_local = 1;
  }
  return n_row_local;
}

Assistant:

PRIVATE Int clear_mark	/* return the new value for tag_mark */
(
    /* === Parameters ======================================================= */

    Int tag_mark,	/* new value of tag_mark */
    Int max_mark,	/* max allowed value of tag_mark */

    Int n_row,		/* number of rows in A */
    Colamd_Row Row []	/* Row [0 ... n_row-1].shared2.mark is set to zero */
)
{
    /* === Local variables ================================================== */

    Int r ;

    if (tag_mark <= 0 || tag_mark >= max_mark)
    {
	for (r = 0 ; r < n_row ; r++)
	{
	    if (ROW_IS_ALIVE (r))
	    {
		Row [r].shared2.mark = 0 ;
	    }
	}
	tag_mark = 1 ;
    }

    return (tag_mark) ;
}